

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O1

void __thiscall Start::StartGameNowTigersBattle10(Start *this,double *credits,uint *bet)

{
  double dVar1;
  pointer piVar2;
  double *credits_00;
  uint uVar3;
  pointer pvVar4;
  pointer pvVar5;
  int iVar6;
  ostream *poVar7;
  Start *this_00;
  pointer pvVar8;
  PrintGameName printWelcome;
  string p;
  uint bet_1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myVectorInStart;
  Bet settingBet;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myMatrixVector;
  Bet currentBet;
  PaytableTigersBattle paytableForGame;
  Matrix myMatrix;
  PrintGameName local_171;
  char *local_170;
  long local_168;
  char local_160;
  undefined7 uStack_15f;
  uint local_14c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_148;
  Start *local_130;
  double *local_128;
  Start local_120;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_f8;
  double local_d8;
  Bet local_d0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_c0;
  PaytableTigersBattle local_a8;
  Matrix local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_148.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130 = this;
  local_128 = credits;
  Matrix::getVectorMatrix
            ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)&local_120,&this->super_Matrix);
  local_a8._myVectorInPaytableTigersBattle.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_148.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8._myVectorInPaytableTigersBattle.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_148.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a8._myVectorInPaytableTigersBattle.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_148.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_148.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_120.super_Matrix._matrixVec.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_148.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_120.super_Matrix._matrixVec.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_148.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_120.super_Matrix._matrixVec.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_120.super_Matrix._matrixVec.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.super_Matrix._matrixVec.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.super_Matrix._matrixVec.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_a8._myVectorInPaytableTigersBattle);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_120);
  local_170 = &local_160;
  local_168 = 0;
  local_160 = '\0';
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_c0,&local_148);
  credits_00 = local_128;
  PaytableTigersBattle::PaytableTigersBattle(&local_a8,&local_c0,*local_128,*bet);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_c0);
  dVar1 = *credits_00;
  while (2.0 <= dVar1) {
    if (dVar1 < (double)*bet) {
      *bet = 2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Changing Bet to min: ",0x15);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," Euro!",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "********************************************************************************************************************"
               ,0x74);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'p\' to Start a Game!",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'e\' to Change the Bet!",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'i\' to see the Paytable!",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'c\' to Cashout!",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'g\' to see the Gamble Info Screen!",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'a\' to add credit!",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'q\' for More Games!",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'l\' To Change Lines!",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Current Credit: ",0x10);
    poVar7 = std::ostream::_M_insert<double>(*credits_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," Euro!",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "********************************************************************************************************************"
               ,0x74);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(string *)&local_170);
    if ((*local_170 == 'p') && (local_168 == 1)) {
      iVar6 = system("CLS");
      if (iVar6 != 0) {
        system("clear");
      }
      *credits_00 = *credits_00 - (double)*bet;
      Matrix::RandomNumbersInMatrix(&local_48,&local_130->super_Matrix,&local_148);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_48);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"---------------------------------------------",0x2d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      Matrix::outPutMatrix(&local_130->super_Matrix,&local_148);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"---------------------------------------------",0x2d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      this_00 = (Start *)std::ostream::put(-8);
      std::ostream::flush();
      checkForCreditsAndBetSuperFire10(this_00,credits_00,bet);
      outputCreditsAndBetCurrent(this_00,credits_00,bet);
      PaytableTigersBattle::PaytableTigersBattleWin10(&local_a8,&local_148,credits_00,bet);
    }
    if ((*local_170 == 'e') && (local_168 == 1)) {
      iVar6 = system("CLS");
      if (iVar6 != 0) {
        system("clear");
      }
      Bet::Bet((Bet *)&local_120,*bet,*credits_00);
      Bet::selectBetTigersBattle10((Bet *)&local_120,bet,credits_00);
      Bet::~Bet((Bet *)&local_120);
    }
    if ((*local_170 == 'i') && (local_168 == 1)) {
      iVar6 = system("CLS");
      if (iVar6 != 0) {
        system("clear");
      }
      PaytableTigersBattle::PaytableTigersBattleWinInfo10(&local_a8);
    }
    if ((*local_170 == 'c') && (local_168 == 1)) {
      if (*credits_00 <= 0.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Nothing to cashout!",0x13);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cashout...",10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Handpay! Call Attendant! ",0x19);
        poVar7 = std::ostream::_M_insert<double>(*credits_00);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," Euro!",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        *credits_00 = 0.0;
      }
    }
    if ((*local_170 == 'g') && (local_168 == 1)) {
      Gamble::Gamble((Gamble *)&local_120);
      Gamble::GambleInfoScreen((Gamble *)&local_120);
      Gamble::~Gamble((Gamble *)&local_120);
    }
    if ((*local_170 == 'a') && (local_168 == 1)) {
      CreditField::CreditField((CreditField *)&local_120);
      CreditField::AddCredit((CreditField *)&local_120,credits_00);
      CreditField::~CreditField((CreditField *)&local_120);
    }
    if ((*local_170 == 'q') && (local_168 == 1)) {
      SelectGame::SelectGame((SelectGame *)&local_120);
      SelectGame::selectGame_Welcome((SelectGame *)&local_120);
      SelectGame::selectGame_Games((SelectGame *)&local_120);
      SelectGame::selectGame_Option((SelectGame *)&local_120,credits_00);
      SelectGame::~SelectGame((SelectGame *)&local_120);
    }
    if ((*local_170 == 'l') && (local_168 == 1)) {
      iVar6 = system("CLS");
      if (iVar6 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName(&local_171);
      PrintGameName::PrintGameNameWelcomeTigersBattle5(&local_171);
      if (*credits_00 <= 1.0 && *credits_00 != 1.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "----------------------------------------------------------------------",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        CreditField::CreditField((CreditField *)&local_120);
        CreditField::AddCredit((CreditField *)&local_120,credits_00);
        CreditField::~CreditField((CreditField *)&local_120);
      }
      local_14c = 0;
      Bet::Bet(&local_d0,0,*credits_00);
      Bet::selectBetTigersBattle5(&local_d0,&local_14c,credits_00);
      local_f8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_60,&local_f8);
      Matrix::Matrix(&local_78,&local_60);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_60);
      uVar3 = local_14c;
      local_d8 = *credits_00;
      Matrix::Matrix(&local_120.super_Matrix);
      local_120._credits = local_d8;
      local_120._bet = uVar3;
      StartGameNowTigersBattle5(&local_120,credits_00,&local_14c);
      Matrix::~Matrix(&local_120.super_Matrix);
      Matrix::~Matrix(&local_78);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_f8);
      Bet::~Bet(&local_d0);
      PrintGameName::~PrintGameName(&local_171);
    }
    if (*credits_00 <= 1.0 && *credits_00 != 1.0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No More Credits To Play on Min Bet! :(",0x26);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      CreditField::CreditField((CreditField *)&local_f8);
      CreditField::AddCredit((CreditField *)&local_f8,credits_00);
      if (*credits_00 <= 1.0 && *credits_00 != 1.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"You need to add atleast 2 Euro!",0x1f);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cashout: ",9);
        poVar7 = std::ostream::_M_insert<double>(*credits_00);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," Euro.",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        *credits_00 = 0.0;
        SelectGame::SelectGame((SelectGame *)&local_120);
        SelectGame::selectGame_Welcome((SelectGame *)&local_120);
        SelectGame::selectGame_Games((SelectGame *)&local_120);
        SelectGame::selectGame_Option((SelectGame *)&local_120,credits_00);
        SelectGame::~SelectGame((SelectGame *)&local_120);
      }
      CreditField::~CreditField((CreditField *)&local_f8);
    }
    pvVar5 = local_148.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar4 = local_148.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = local_148.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_148.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_148.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        piVar2 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar2 != (pointer)0x0) {
          operator_delete(piVar2,(long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)piVar2);
        }
        pvVar8 = pvVar8 + 1;
      } while (pvVar8 != pvVar5);
      local_148.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
    }
    credits_00 = local_128;
    dVar1 = *local_128;
  }
  PaytableTigersBattle::~PaytableTigersBattle(&local_a8);
  if (local_170 != &local_160) {
    operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_148);
  return;
}

Assistant:

void Start::StartGameNowTigersBattle10(double& credits, unsigned int& bet) {

	std::vector<std::vector<int>>myVectorInStart;
	myVectorInStart = getVectorMatrix();
	std::string p;

	unsigned int minBet = 2;
	PaytableTigersBattle paytableForGame(myVectorInStart, credits, bet);
	while (credits >= minBet) {
		if (credits < bet && credits >= minBet) {
			bet = minBet;
			std::cout << "Changing Bet to min: " << bet << " Euro!" << std::endl;
		}
		std::cout << "********************************************************************************************************************" << std::endl;
		std::cout << "Press 'p' to Start a Game!" << std::endl;
		std::cout << "Press 'e' to Change the Bet!" << std::endl;
		std::cout << "Press 'i' to see the Paytable!" << std::endl;
		std::cout << "Press 'c' to Cashout!" << std::endl;
		std::cout << "Press 'g' to see the Gamble Info Screen!" << std::endl;
		std::cout << "Press 'a' to add credit!" << std::endl;
		std::cout << "Press 'q' for More Games!" << std::endl;
		std::cout << "Press 'l' To Change Lines!" << std::endl;
		std::cout << "Current Credit: " << credits << " Euro!" << std::endl;
		std::cout << "********************************************************************************************************************" << std::endl;

		std::cin >> p;
		//new code here for safety
		/*while(p.size() > 1) {
			std::cin >> p;
		}*/
		if (p[0] == 'p' && p.size() == 1) {
			//clears screen
			if (system("CLS")) system("clear");

			takeCreditsWithBet(credits, bet);
			RandomNumbersInMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl; std::cout << " " << std::endl;
			outPutMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl;
			checkForCreditsAndBetSuperFire10(credits, bet);
			outputCreditsAndBetCurrent(credits, bet);
			paytableForGame.PaytableTigersBattleWin10(myVectorInStart, credits, bet);
		}
		if (p[0] == 'e' && p.size() == 1) {
			if (system("CLS")) system("clear");
			Bet settingBet(bet, credits);
			settingBet.selectBetTigersBattle10(bet, credits);
		}
		if (p[0] == 'i' && p.size() == 1) {
			if (system("CLS")) system("clear");
			paytableForGame.PaytableTigersBattleWinInfo10();
		}
		if (p[0] == 'c' && p.size() == 1) {
			if (credits > 0.0) {
				std::cout << "Cashout..." << std::endl;
				std::cout << "Handpay! Call Attendant! " << credits << " Euro!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
				credits = 0;
			}
			else {
				std::cout << "Nothing to cashout!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
			}
			//exit(0);
		}
		if (p[0] == 'g' && p.size() == 1) {

			Gamble gambleInfoScreen;
			gambleInfoScreen.GambleInfoScreen();
		}
		if (p[0] == 'a' && p.size() == 1) {
			CreditField addCredit;
			addCredit.AddCredit(credits);
		}
		if (p[0] == 'q' && p.size() == 1) {
			SelectGame selectgame;
			selectgame.selectGame_Welcome();
			selectgame.selectGame_Games();

			//choosing a game
			selectgame.selectGame_Option(credits);
		}
		if (p[0] == 'l' && p.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcomeTigersBattle5(); // changed
			//credit
			if (credits < 1) {
				std::cout << "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetTigersBattle5(bet, credits); //Changing to 5 Lines bet 1 to 5 

			//matrix 2D
			std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNowTigersBattle5(credits, bet);
		}

		if (credits < 1) {
			std::cout << "No More Credits To Play on Min Bet! :(" << std::endl;
			CreditField addCreditBeforeExit;
			addCreditBeforeExit.AddCredit(credits);
			if (credits < 1) {
				std::cout << "You need to add atleast 2 Euro!" << std::endl;
				std::cout << "Cashout: " << credits << " Euro." << std::endl;
				credits = 0;
				//Sleep(2000);
				SelectGame selectgame;
				selectgame.selectGame_Welcome();
				selectgame.selectGame_Games();

				//choosing a game
				selectgame.selectGame_Option(credits);
			}
		}

		myVectorInStart.clear();
	}
}